

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

LinkerScriptToken * nextToken(void)

{
  bool bVar1;
  int iVar2;
  LinkerScriptCommand LVar3;
  SectionType SVar4;
  bool local_75;
  EnumSeqIterator<SectionType> local_70;
  SectionType type;
  EnumSeqIterator<SectionType> __end5;
  EnumSeqIterator<SectionType> __begin5;
  EnumSeq<SectionType> *__range5;
  EnumSeqIterator<LinkerScriptCommand> local_50;
  LinkerScriptCommand i;
  EnumSeqIterator<LinkerScriptCommand> __end4;
  EnumSeqIterator<LinkerScriptCommand> __begin4;
  EnumSeq<LinkerScriptCommand> *__range4;
  size_t capacity_1;
  size_t size_1;
  char *str;
  size_t capacity;
  size_t size;
  int curchar;
  
  if (nextToken::token.type == TOKEN_STRING) {
    free(nextToken::token.attr.string);
  }
  do {
    size._4_4_ = nextChar();
    bVar1 = isWhiteSpace(size._4_4_);
  } while (bVar1);
  if (size._4_4_ == 0x3b) {
    do {
      size._4_4_ = nextChar();
      bVar1 = isNewline(size._4_4_);
      local_75 = !bVar1 && size._4_4_ != -1;
    } while (local_75);
  }
  if (size._4_4_ == -1) {
    nextToken::token.type = TOKEN_EOF;
  }
  else {
    bVar1 = isNewline(size._4_4_);
    if (bVar1) {
      nextToken::token.type = TOKEN_NEWLINE;
      if ((size._4_4_ == 0xd) && (iVar2 = nextChar(), iVar2 != 10)) {
        ungetc(iVar2,(FILE *)linkerScript);
      }
    }
    else if (size._4_4_ == 0x22) {
      nextToken::token.type = TOKEN_STRING;
      nextToken::token.attr.string = (char *)0x0;
      capacity = 0;
      str = (char *)0x10;
      do {
        size._4_4_ = nextChar();
        if ((size._4_4_ == -1) || (bVar1 = isNewline(size._4_4_), bVar1)) {
          errx("%s(%u): Unterminated string",linkerScriptName,(ulong)lineNo);
        }
        if (size._4_4_ == 0x22) {
          size._4_4_ = 0;
        }
        else if (size._4_4_ == 0x5c) {
          size._4_4_ = nextChar();
          if ((size._4_4_ == -1) || (bVar1 = isNewline(size._4_4_), bVar1)) {
            errx("%s(%u): Unterminated string",linkerScriptName,(ulong)lineNo);
          }
          if (size._4_4_ == 0x6e) {
            size._4_4_ = 10;
          }
          else if (size._4_4_ == 0x72) {
            size._4_4_ = 0xd;
          }
          else if (size._4_4_ == 0x74) {
            size._4_4_ = 9;
          }
          else if ((size._4_4_ != 0x5c) && (size._4_4_ != 0x22)) {
            errx("%s(%u): Illegal character escape",linkerScriptName,(ulong)lineNo);
          }
        }
        if ((str <= capacity) || (nextToken::token.attr.string == (char *)0x0)) {
          str = (char *)((long)str << 1);
          nextToken::token.attr.string = (char *)realloc(nextToken::token.attr.string,(size_t)str);
          if (nextToken::token.attr.string == (char *)0x0) {
            err("%s: Failed to allocate memory for string","nextToken");
          }
        }
        nextToken::token.attr.string[capacity] = (char)size._4_4_;
        capacity = capacity + 1;
      } while (size._4_4_ != 0);
    }
    else {
      size_1 = 0;
      capacity_1 = 0;
      __range4 = (EnumSeq<LinkerScriptCommand> *)0x8;
      while( true ) {
        if ((__range4 <= capacity_1) || (size_1 == 0)) {
          __range4 = (EnumSeq<LinkerScriptCommand> *)((long)__range4 << 1);
          size_1 = (size_t)realloc((void *)size_1,(size_t)__range4);
          if ((void *)size_1 == (void *)0x0) {
            err("%s: Failed to allocate memory for token","nextToken");
          }
        }
        iVar2 = toupper(size._4_4_);
        *(char *)(size_1 + capacity_1) = (char)iVar2;
        capacity_1 = capacity_1 + 1;
        if (size._4_4_ == 0) break;
        size._4_4_ = nextChar();
        bVar1 = isWhiteSpace(size._4_4_);
        if (((bVar1) || (bVar1 = isNewline(size._4_4_), bVar1)) || (size._4_4_ == 0x3b)) {
          ungetc(size._4_4_,(FILE *)linkerScript);
          size._4_4_ = 0;
        }
      }
      nextToken::token.type = TOKEN_INVALID;
      EnumSeq<LinkerScriptCommand>::EnumSeq((EnumSeq<LinkerScriptCommand> *)&__end4,COMMAND_INVALID)
      ;
      i = (LinkerScriptCommand)
          EnumSeq<LinkerScriptCommand>::begin((EnumSeq<LinkerScriptCommand> *)&__end4);
      local_50 = EnumSeq<LinkerScriptCommand>::end((EnumSeq<LinkerScriptCommand> *)&__end4);
      while (bVar1 = operator!=((EnumSeqIterator<LinkerScriptCommand> *)&i,&local_50), bVar1) {
        LVar3 = EnumSeqIterator<LinkerScriptCommand>::operator*
                          ((EnumSeqIterator<LinkerScriptCommand> *)&i);
        iVar2 = strcmp(commands[LVar3],(char *)size_1);
        if (iVar2 == 0) {
          nextToken::token.type = TOKEN_COMMAND;
          nextToken::token.attr.command = LVar3;
          break;
        }
        EnumSeqIterator<LinkerScriptCommand>::operator++((EnumSeqIterator<LinkerScriptCommand> *)&i)
        ;
      }
      if (nextToken::token.type == TOKEN_INVALID) {
        EnumSeq<SectionType>::EnumSeq((EnumSeq<SectionType> *)&__end5,SECTTYPE_INVALID);
        type = (SectionType)EnumSeq<SectionType>::begin((EnumSeq<SectionType> *)&__end5);
        local_70 = EnumSeq<SectionType>::end((EnumSeq<SectionType> *)&__end5);
        while (bVar1 = operator!=((EnumSeqIterator<SectionType> *)&type,&local_70), bVar1) {
          SVar4 = EnumSeqIterator<SectionType>::operator*((EnumSeqIterator<SectionType> *)&type);
          iVar2 = strcmp(sectionTypeInfo[SVar4].name,(char *)size_1);
          if (iVar2 == 0) {
            nextToken::token.type = TOKEN_BANK;
            nextToken::token.attr.secttype = SVar4;
            break;
          }
          EnumSeqIterator<SectionType>::operator++((EnumSeqIterator<SectionType> *)&type);
        }
      }
      if ((nextToken::token.type == TOKEN_INVALID) &&
         (iVar2 = strcmp("INCLUDE",(char *)size_1), iVar2 == 0)) {
        nextToken::token.type = TOKEN_INCLUDE;
      }
      if (nextToken::token.type == TOKEN_INVALID) {
        bVar1 = tryParseNumber((char *)size_1,&nextToken::token.attr.number);
        if (!bVar1) {
          errx("%s(%u): Unknown token \"%s\"",linkerScriptName,(ulong)lineNo,size_1);
        }
        nextToken::token.type = TOKEN_NUMBER;
      }
      free((void *)size_1);
    }
  }
  return &nextToken::token;
}

Assistant:

static struct LinkerScriptToken *nextToken(void)
{
	static struct LinkerScriptToken token;
	int curchar;

	// If the token has a string, make sure to avoid leaking it
	if (token.type == TOKEN_STRING)
		free(token.attr.string);

	// Skip initial whitespace...
	do
		curchar = nextChar();
	while (isWhiteSpace(curchar));

	// If this is a comment, skip to the end of the line
	if (curchar == ';') {
		do {
			curchar = nextChar();
		} while (!isNewline(curchar) && curchar != EOF);
	}

	if (curchar == EOF) {
		token.type = TOKEN_EOF;
	} else if (isNewline(curchar)) {
		// If we have a newline char, this is a newline token
		token.type = TOKEN_NEWLINE;

		if (curchar == '\r') {
			// Handle CRLF
			curchar = nextChar();
			if (curchar != '\n')
				ungetc(curchar, linkerScript);
		}
	} else if (curchar == '"') {
		// If we have a string start, this is a string
		token.type = TOKEN_STRING;
		token.attr.string = NULL; // Force initial alloc

		size_t size = 0;
		size_t capacity = 16; // Half of the default capacity

		do {
			curchar = nextChar();
			if (curchar == EOF || isNewline(curchar)) {
				errx("%s(%" PRIu32 "): Unterminated string",
				     linkerScriptName, lineNo);
			} else if (curchar == '"') {
				// Quotes force a string termination
				curchar = '\0';
			} else if (curchar == '\\') {
				// Backslashes are escape sequences
				curchar = nextChar();
				if (curchar == EOF || isNewline(curchar))
					errx("%s(%" PRIu32 "): Unterminated string",
					     linkerScriptName, lineNo);
				else if (curchar == 'n')
					curchar = '\n';
				else if (curchar == 'r')
					curchar = '\r';
				else if (curchar == 't')
					curchar = '\t';
				else if (curchar != '\\' && curchar != '"')
					errx("%s(%" PRIu32 "): Illegal character escape",
					     linkerScriptName, lineNo);
			}

			if (size >= capacity || token.attr.string == NULL) {
				capacity *= 2;
				token.attr.string = (char *)realloc(token.attr.string, capacity);
				if (!token.attr.string)
					err("%s: Failed to allocate memory for string",
					    __func__);
			}
			token.attr.string[size++] = curchar;
		} while (curchar);
	} else {
		// This is either a number, command or bank, that is: a word
		char *str = NULL;
		size_t size = 0;
		size_t capacity = 8; // Half of the default capacity

		for (;;) {
			if (size >= capacity || str == NULL) {
				capacity *= 2;
				str = (char *)realloc(str, capacity);
				if (!str)
					err("%s: Failed to allocate memory for token",
					    __func__);
			}
			str[size] = toupper(curchar);
			size++;

			if (!curchar)
				break;

			curchar = nextChar();
			// Whitespace, a newline or a comment end the token
			if (isWhiteSpace(curchar) || isNewline(curchar) || curchar == ';') {
				ungetc(curchar, linkerScript);
				curchar = '\0';
			}
		}

		token.type = TOKEN_INVALID;

		// Try to match a command
		for (enum LinkerScriptCommand i : EnumSeq(COMMAND_INVALID)) {
			if (!strcmp(commands[i], str)) {
				token.type = TOKEN_COMMAND;
				token.attr.command = i;
				break;
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match a bank specifier
			for (enum SectionType type : EnumSeq(SECTTYPE_INVALID)) {
				if (!strcmp(sectionTypeInfo[type].name, str)) {
					token.type = TOKEN_BANK;
					token.attr.secttype = type;
					break;
				}
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match an include token
			if (!strcmp("INCLUDE", str))
				token.type = TOKEN_INCLUDE;
		}

		if (token.type == TOKEN_INVALID) {
			// None of the strings matched, do we have a number?
			if (tryParseNumber(str, &token.attr.number))
				token.type = TOKEN_NUMBER;
			else
				errx("%s(%" PRIu32 "): Unknown token \"%s\"",
				     linkerScriptName, lineNo, str);
		}

		free(str);
	}

	return &token;
}